

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-seri.c
# Opt level: O0

void push_value(lua_State *L,read_block *rb,int type,int cookie)

{
  lua_Integer n_00;
  void *p;
  ushort *puVar1;
  int *piVar2;
  double n_01;
  uint32_t n_1;
  uint32_t *plen_1;
  uint16_t n;
  uint16_t *plen;
  int cookie_local;
  int type_local;
  read_block *rb_local;
  lua_State *L_local;
  
  switch(type) {
  case 0:
    lua_pushnil(L);
    break;
  case 1:
    lua_pushboolean(L,cookie);
    break;
  case 2:
    if (cookie == 8) {
      n_01 = get_real(L,rb);
      lua_pushnumber(L,n_01);
    }
    else {
      n_00 = get_integer(L,rb,cookie);
      lua_pushinteger(L,n_00);
    }
    break;
  case 3:
    p = get_pointer(L,rb);
    lua_pushlightuserdata(L,p);
    break;
  case 4:
    get_buffer(L,rb,cookie);
    break;
  case 5:
    if (cookie == 2) {
      puVar1 = (ushort *)rb_read(rb,2);
      if (puVar1 == (ushort *)0x0) {
        invalid_stream_line(L,rb,0x1eb);
      }
      get_buffer(L,rb,(uint)*puVar1);
    }
    else {
      if (cookie != 4) {
        invalid_stream_line(L,rb,0x1f2);
      }
      piVar2 = (int *)rb_read(rb,4);
      if (piVar2 == (int *)0x0) {
        invalid_stream_line(L,rb,0x1f6);
      }
      get_buffer(L,rb,*piVar2);
    }
    break;
  case 6:
    unpack_table(L,rb,cookie);
    break;
  default:
    invalid_stream_line(L,rb,0x203);
  }
  return;
}

Assistant:

static void
push_value(lua_State *L, struct read_block *rb, int type, int cookie) {
	switch(type) {
	case TYPE_NIL:
		lua_pushnil(L);
		break;
	case TYPE_BOOLEAN:
		lua_pushboolean(L,cookie);
		break;
	case TYPE_NUMBER:
		if (cookie == TYPE_NUMBER_REAL) {
			lua_pushnumber(L,get_real(L,rb));
		} else {
			lua_pushinteger(L, get_integer(L, rb, cookie));
		}
		break;
	case TYPE_USERDATA:
		lua_pushlightuserdata(L,get_pointer(L,rb));
		break;
	case TYPE_SHORT_STRING:
		get_buffer(L,rb,cookie);
		break;
	case TYPE_LONG_STRING: {
		if (cookie == 2) {
			uint16_t *plen = rb_read(rb, 2);
			if (plen == NULL) {
				invalid_stream(L,rb);
			}
			uint16_t n;
			memcpy(&n, plen, sizeof(n));
			get_buffer(L,rb,n);
		} else {
			if (cookie != 4) {
				invalid_stream(L,rb);
			}
			uint32_t *plen = rb_read(rb, 4);
			if (plen == NULL) {
				invalid_stream(L,rb);
			}
			uint32_t n;
			memcpy(&n, plen, sizeof(n));
			get_buffer(L,rb,n);
		}
		break;
	}
	case TYPE_TABLE: {
		unpack_table(L,rb,cookie);
		break;
	}
	default: {
		invalid_stream(L,rb);
		break;
	}
	}
}